

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_scriptedmarine.cpp
# Opt level: O3

int AF_A_M_Refire(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  AActor *actor;
  VMValue *pVVar7;
  AActor *t2;
  char *__assertion;
  bool bVar8;
  bool bVar9;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c31f9;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005c31e9;
  actor = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (actor == (AActor *)0x0) goto LAB_005c3019;
    pPVar6 = (actor->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (actor->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar8 = pPVar6 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar8;
    bVar9 = pPVar6 == pPVar3;
    if (!bVar9 && !bVar8) {
      do {
        pPVar6 = pPVar6->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    pVVar7 = (VMValue *)(ulong)(bVar9 || bVar8);
    uVar5 = (uint)bVar8;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005c31f9;
    }
  }
  else {
    if (actor != (AActor *)0x0) goto LAB_005c31e9;
LAB_005c3019:
    actor = (AActor *)0x0;
    pVVar7 = param;
    uVar5 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) {
LAB_005c30f6:
    bVar8 = false;
  }
  else {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005c31e9:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005c31f9;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar6 = (PClass *)puVar2[1];
          if (pPVar6 == (PClass *)0x0) {
            pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar5,ret);
            puVar2[1] = pPVar6;
          }
          bVar8 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar3 && bVar8) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar8 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar3) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          if (!bVar8) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005c31f9;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005c31e9;
    }
    if (numparam < 3) goto LAB_005c30f6;
    VVar1 = param[2].field_0.field_3.Type;
    if ((VVar1 != 0xff) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005c31f9:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                    ,0x9e,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if (numparam == 3) goto LAB_005c30f6;
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 != '\0') {
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                      ,0x9f,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      goto LAB_005c30f6;
    }
    bVar8 = param[3].field_0.i != 0;
  }
  t2 = (actor->target).field_0.p;
  if (t2 != (AActor *)0x0) {
    if (((t2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (0 < t2->health) {
        if ((bVar8) || (actor->MissileState == (FState *)0x0)) {
          bVar8 = AActor::CheckMeleeRange(actor);
          if (!bVar8) goto LAB_005c31bc;
          t2 = (actor->target).field_0.p;
          if (t2 != (AActor *)0x0) goto LAB_005c313d;
LAB_005c314e:
          t2 = (AActor *)0x0;
        }
        else {
LAB_005c313d:
          if (((t2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (actor->target).field_0.p = (AActor *)0x0;
            goto LAB_005c314e;
          }
        }
        bVar8 = P_CheckSight(actor,t2,0);
        if ((bVar8) && (uVar5 = FRandom::GenRand32(&pr_m_refire), (uVar5 & 0xfc) != 0)) {
          return 0;
        }
        goto LAB_005c31bc;
      }
    }
    else {
      (actor->target).field_0.p = (AActor *)0x0;
    }
  }
  if ((((actor->MissileState != (FState *)0x0) &&
       (uVar5 = FRandom::GenRand32(&pr_m_refire), (uVar5 & 0xe0) < 0xa0)) &&
      (bVar8 = P_LookForPlayers(actor,1,(FLookExParams *)0x0), bVar8)) &&
     (bVar8 = P_CheckMissileRange(actor), bVar8)) {
    return 0;
  }
LAB_005c31bc:
  AActor::SetState(actor,actor->state + 1,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_M_Refire)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_BOOL_OPT(ignoremissile)	{ ignoremissile = false; }

	if (self->target == NULL || self->target->health <= 0)
	{
		if (self->MissileState && pr_m_refire() < 160)
		{ // Look for a new target most of the time
			if (P_LookForPlayers (self, true, NULL) && P_CheckMissileRange (self))
			{ // Found somebody new and in range, so don't stop shooting
				return 0;
			}
		}
		self->SetState (self->state + 1);
		return 0;
	}
	if (((ignoremissile || self->MissileState == NULL) && !self->CheckMeleeRange ()) ||
		!P_CheckSight (self, self->target) ||
		pr_m_refire() < 4)	// Small chance of stopping even when target not dead
	{
		self->SetState (self->state + 1);
	}
	return 0;
}